

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O1

void __thiscall avro::ostream::~ostream(ostream *this)

{
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1d9db0;
  *(undefined8 *)&(this->super_ostream).field_0x58 = 0x1d9dd8;
  *(undefined ***)&(this->super_ostream).field_0x8 = &PTR__ostreambuf_001d9e60;
  boost::detail::shared_count::~shared_count((shared_count *)&(this->super_ostream).field_0x50);
  *(code **)&(this->super_ostream).field_0x8 = sysconf;
  std::locale::~locale((locale *)&(this->super_ostream).field_0x40);
  std::ios_base::~ios_base((ios_base *)&(this->super_ostream).field_0x58);
  return;
}

Assistant:

class AVRO_DECL ostream : public std::ostream {

  public:

    /// Default constructor, creates a new OutputBuffer.
    ostream() : 
        std::ostream(&obuf_) 
    { }

    /// Output to a specific buffer.
    ostream(OutputBuffer &buf) : 
        std::ostream(&obuf_),
        obuf_(buf)
    { }

    /// Return the output buffer created by the write operations to this ostream.
    const OutputBuffer &getBuffer() const {
        return obuf_.getBuffer();
    }

  protected:

    ostreambuf obuf_;
}